

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stmt.cc
# Opt level: O2

void __thiscall kratos::SwitchStmt::remove_stmt(SwitchStmt *this,shared_ptr<kratos::Stmt> *stmt)

{
  element_type *peVar1;
  _Base_ptr p_Var2;
  _Base_ptr p_Var3;
  
  p_Var2 = (this->body_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  do {
    if ((_Rb_tree_header *)p_Var2 == &(this->body_)._M_t._M_impl.super__Rb_tree_header) {
      return;
    }
    p_Var3 = *(_Base_ptr *)(p_Var2[1]._M_left + 6);
    do {
      if (p_Var3 == p_Var2[1]._M_left[6]._M_parent) goto LAB_001a5823;
      peVar1 = *(element_type **)p_Var3;
      p_Var3 = (_Base_ptr)&p_Var3->_M_left;
    } while (peVar1 != (stmt->super___shared_ptr<kratos::Stmt,_(__gnu_cxx::_Lock_policy)2>)._M_ptr);
    remove_switch_case(this,(shared_ptr<kratos::Const> *)(p_Var2 + 1),stmt);
LAB_001a5823:
    p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2);
  } while( true );
}

Assistant:

void SwitchStmt::remove_stmt(const std::shared_ptr<kratos::Stmt> &stmt) {
    for (auto &[c, stmts] : body_) {
        for (auto const &s : *stmts) {
            if (s == stmt) {
                remove_switch_case(c, stmt);
                break;
            }
        }
    }
}